

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::SerializeWithCachedSizes
          (TreeEnsembleParameters_TreeNode_EvaluationInfo *this,CodedOutputStream *output)

{
  double value;
  
  if (this->evaluationindex_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->evaluationindex_,output);
  }
  value = this->evaluationvalue_;
  if ((value == 0.0) && (!NAN(value))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteDouble(2,value,output);
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode_EvaluationInfo::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 evaluationIndex = 1;
  if (this->evaluationindex() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->evaluationindex(), output);
  }

  // double evaluationValue = 2;
  if (this->evaluationvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(2, this->evaluationvalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
}